

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_ppm_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  uint uVar1;
  jpc_ppm_t *ppm;
  jas_stream_t *out_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  uVar1 = jas_stream_write(out,(ms->parms).ppm.data,(uint)(ms->parms).sot.len);
  if ((ulong)uVar1 == (ms->parms).sot.len) {
    ms_local._4_4_ = 0;
  }
  else {
    ms_local._4_4_ = -1;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_ppm_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_ppm_t *ppm = &ms->parms.ppm;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	if (JAS_CAST(jas_uint, jas_stream_write(out, (char *) ppm->data, ppm->len)) != ppm->len) {
		return -1;
	}
	return 0;
}